

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

RegOpnd * __thiscall IR::Opnd::FindRegUse(Opnd *this,RegOpnd *regOpnd)

{
  StackSym *pSVar1;
  RegOpnd *pRVar2;
  
  pSVar1 = regOpnd->m_sym;
  if (this->m_kind == OpndKindIndir) {
    pRVar2 = (RegOpnd *)this[1]._vptr_Opnd;
    if (((pRVar2 == (RegOpnd *)0x0) || (pRVar2->m_sym != pSVar1)) &&
       ((pRVar2 = *(RegOpnd **)&this[1].m_valueType, pRVar2 == (RegOpnd *)0x0 ||
        (pRVar2->m_sym != pSVar1)))) {
      pRVar2 = (RegOpnd *)0x0;
    }
    return pRVar2;
  }
  if (this->m_kind == OpndKindReg) {
    pRVar2 = (RegOpnd *)0x0;
    if ((StackSym *)this[1]._vptr_Opnd == pSVar1) {
      pRVar2 = (RegOpnd *)this;
    }
    return pRVar2;
  }
  return (RegOpnd *)0x0;
}

Assistant:

IR::RegOpnd *
Opnd::FindRegUse(IR::RegOpnd *regOpnd)
{
    StackSym *regSym = regOpnd->m_sym;

    if (this->IsRegOpnd())
    {
        if (this->AsRegOpnd()->m_sym == regSym)
        {
            return this->AsRegOpnd();
        }
    }
    else if (this->IsIndirOpnd())
    {
        IndirOpnd *indirOpnd = this->AsIndirOpnd();
        if (indirOpnd->GetBaseOpnd() && indirOpnd->GetBaseOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetBaseOpnd();
        }
        if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetIndexOpnd();
        }
    }

    return nullptr;
}